

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printPredicateOperand(MCInst *MI,uint OpNo,SStream *O,char *Modifier)

{
  int cc;
  arm64_cc aVar1;
  int iVar2;
  MCOperand *op;
  int64_t iVar3;
  uint Code;
  char *Modifier_local;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  cc = (int)iVar3;
  aVar1 = cc_normalize(cc);
  (MI->flat_insn->detail->field_6).arm64.cc = aVar1;
  iVar2 = strcmp(Modifier,"cc");
  if (iVar2 == 0) {
    if ((cc == 4) || (cc - 6U < 2)) {
      SStream_concat0(O,"ge");
      return;
    }
    if ((cc != 0xc) && (1 < cc - 0xeU)) {
      if ((cc == 0x24) || (cc - 0x26U < 2)) {
        SStream_concat0(O,"le");
        return;
      }
      if ((cc == 0x2c) || (cc - 0x2eU < 2)) {
        SStream_concat0(O,"gt");
        return;
      }
      if ((cc == 0x44) || (cc - 0x46U < 2)) {
        SStream_concat0(O,"ne");
        return;
      }
      if ((cc == 0x4c) || (cc - 0x4eU < 2)) {
        SStream_concat0(O,"eq");
        return;
      }
      if ((cc == 100) || (cc - 0x66U < 2)) {
        SStream_concat0(O,"nu");
        return;
      }
      if ((cc == 0x6c) || (cc - 0x6eU < 2)) {
        SStream_concat0(O,"un");
        return;
      }
      if (cc - 0x400U < 2) {
        SStream_concat0(O,"invalid-predicate");
        return;
      }
    }
    SStream_concat0(O,"lt");
    return;
  }
  iVar2 = strcmp(Modifier,"pm");
  if (iVar2 != 0) {
    printOperand(MI,OpNo + 1,O);
    return;
  }
  if (cc == 4) {
    return;
  }
  if (cc == 6) {
LAB_001f95ec:
    SStream_concat0(O,"-");
  }
  else {
    if (cc != 7) {
      if (cc == 0xc) {
        return;
      }
      if (cc == 0xe) goto LAB_001f95ec;
      if (cc != 0xf) {
        if (cc == 0x24) {
          return;
        }
        if (cc == 0x26) goto LAB_001f95ec;
        if (cc != 0x27) {
          if (cc == 0x2c) {
            return;
          }
          if (cc == 0x2e) goto LAB_001f95ec;
          if (cc != 0x2f) {
            if (cc == 0x44) {
              return;
            }
            if (cc == 0x46) goto LAB_001f95ec;
            if (cc != 0x47) {
              if (cc == 0x4c) {
                return;
              }
              if (cc == 0x4e) goto LAB_001f95ec;
              if (cc != 0x4f) {
                if (cc == 100) {
                  return;
                }
                if (cc == 0x66) goto LAB_001f95ec;
                if (cc != 0x67) {
                  if (cc == 0x6c) {
                    return;
                  }
                  if (cc == 0x6e) goto LAB_001f95ec;
                  if (cc != 0x6f) {
                    if (1 < cc - 0x400U) {
                      return;
                    }
                    SStream_concat0(O,"invalid-predicate");
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
    SStream_concat0(O,"+");
  }
  return;
}

Assistant:

static void printPredicateOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	ARMCC_CondCodes CC = (ARMCC_CondCodes)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// Handle the undefined 15 CC value here for printing so we don't abort().
	if ((unsigned)CC == 15) {
		SStream_concat0(O, "<und>");
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.cc = ARM_CC_INVALID;
	} else {
		if (CC != ARMCC_AL) {
			SStream_concat0(O, ARMCC_ARMCondCodeToString(CC));
		}
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.cc = CC + 1;
	}
}